

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::ResolveTargetsInGeneratorExpression
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  cmLocalGenerator *this_00;
  char cVar6;
  undefined1 local_110 [8];
  string libName;
  size_type endPos_1;
  size_type nameStartPos_2;
  undefined1 local_d8 [8];
  string targetName_1;
  size_type endPos;
  size_type nameStartPos_1;
  string errorString;
  undefined1 local_78 [8];
  string targetName;
  size_type nextOpenPos;
  size_type commaPos;
  size_type closePos;
  size_type nameStartPos;
  size_type lastPos;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  cmGeneratorTarget *target_local;
  string *input_local;
  cmExportFileGenerator *this_local;
  
  while( true ) {
    lVar3 = std::__cxx11::string::find((char *)input,0x94e14c);
    cVar6 = (char)input;
    if (lVar3 == -1) break;
    uVar4 = std::__cxx11::string::find(cVar6,0x3e);
    uVar5 = std::__cxx11::string::find(cVar6,0x2c);
    targetName.field_2._8_8_ = std::__cxx11::string::find((char *)input,0x95c8ab);
    if ((((uVar5 != 0xffffffffffffffff) && (uVar4 != 0xffffffffffffffff)) && (uVar5 <= uVar4)) &&
       (uVar5 <= (ulong)targetName.field_2._8_8_)) {
      std::__cxx11::string::substr((ulong)local_78,(ulong)input);
      bVar1 = AddTargetNamespace(this,(string *)local_78,target,missingTargets);
      if (bVar1) {
        std::__cxx11::string::replace
                  ((ulong)input,lVar3 + 0x12U,(string *)(uVar5 - (lVar3 + 0x12U)));
      }
      std::__cxx11::string::size();
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  std::__cxx11::string::string((string *)&nameStartPos_1);
  do {
    uVar4 = std::__cxx11::string::find((char *)input,0x93634a);
    if (uVar4 == 0xffffffffffffffff) break;
    targetName_1.field_2._8_8_ = std::__cxx11::string::find(cVar6,0x3e);
    if (targetName_1.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=
                ((string *)&nameStartPos_1,"$<TARGET_NAME:...> expression incomplete");
      break;
    }
    std::__cxx11::string::substr((ulong)local_d8,(ulong)input);
    lVar3 = std::__cxx11::string::find(local_d8,0x95c8ab);
    if (lVar3 == -1) {
      bVar1 = AddTargetNamespace(this,(string *)local_d8,target,missingTargets);
      if (bVar1) {
        std::__cxx11::string::replace
                  ((ulong)input,uVar4,(string *)((targetName_1.field_2._8_8_ - uVar4) + 1));
        nameStartPos_2._4_4_ = 0;
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&nameStartPos_1,
                   "$<TARGET_NAME:...> requires its parameter to be a reachable target.");
        nameStartPos_2._4_4_ = 5;
      }
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&nameStartPos_1,
                 "$<TARGET_NAME:...> requires its parameter to be a literal.");
      nameStartPos_2._4_4_ = 5;
    }
    std::__cxx11::string::~string((string *)local_d8);
  } while (nameStartPos_2._4_4_ == 0);
  lastPos = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::empty();
    bVar1 = false;
    if ((uVar2 & 1) != 0) {
      lastPos = std::__cxx11::string::find((char *)input,0x945f7c);
      bVar1 = lastPos != 0xffffffffffffffff;
    }
    if (!bVar1) goto LAB_00516ff8;
    libName.field_2._8_8_ = std::__cxx11::string::find(cVar6,0x3e);
    if (libName.field_2._8_8_ == -1) break;
    std::__cxx11::string::substr((ulong)local_110,(ulong)input);
    bVar1 = cmGeneratorExpression::IsValidTargetName((string *)local_110);
    if ((bVar1) &&
       (bVar1 = AddTargetNamespace(this,(string *)local_110,target,missingTargets), bVar1)) {
      std::__cxx11::string::replace
                ((ulong)input,lastPos + 0xc,(string *)(libName.field_2._8_8_ - (lastPos + 0xc)));
    }
    std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)local_110);
  }
  std::__cxx11::string::operator=
            ((string *)&nameStartPos_1,"$<LINK_ONLY:...> expression incomplete");
LAB_00516ff8:
  (*this->_vptr_cmExportFileGenerator[0x11])(this,input);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    this_00 = cmGeneratorTarget::GetLocalGenerator(target);
    cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,(string *)&nameStartPos_1);
  }
  std::__cxx11::string::~string((string *)&nameStartPos_1);
  return;
}

Assistant:

void cmExportFileGenerator::ResolveTargetsInGeneratorExpression(
  std::string& input, cmGeneratorTarget* target,
  std::vector<std::string>& missingTargets)
{
  std::string::size_type pos = 0;
  std::string::size_type lastPos = pos;

  while ((pos = input.find("$<TARGET_PROPERTY:", lastPos)) !=
         std::string::npos) {
    std::string::size_type nameStartPos =
      pos + sizeof("$<TARGET_PROPERTY:") - 1;
    std::string::size_type closePos = input.find('>', nameStartPos);
    std::string::size_type commaPos = input.find(',', nameStartPos);
    std::string::size_type nextOpenPos = input.find("$<", nameStartPos);
    if (commaPos == std::string::npos    // Implied 'this' target
        || closePos == std::string::npos // Incomplete expression.
        || closePos < commaPos           // Implied 'this' target
        || nextOpenPos < commaPos)       // Non-literal
    {
      lastPos = nameStartPos;
      continue;
    }

    std::string targetName =
      input.substr(nameStartPos, commaPos - nameStartPos);

    if (this->AddTargetNamespace(targetName, target, missingTargets)) {
      input.replace(nameStartPos, commaPos - nameStartPos, targetName);
    }
    lastPos = nameStartPos + targetName.size() + 1;
  }

  std::string errorString;
  pos = 0;
  lastPos = pos;
  while ((pos = input.find("$<TARGET_NAME:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + sizeof("$<TARGET_NAME:") - 1;
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<TARGET_NAME:...> expression incomplete";
      break;
    }
    std::string targetName = input.substr(nameStartPos, endPos - nameStartPos);
    if (targetName.find("$<") != std::string::npos) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "literal.";
      break;
    }
    if (!this->AddTargetNamespace(targetName, target, missingTargets)) {
      errorString = "$<TARGET_NAME:...> requires its parameter to be a "
                    "reachable target.";
      break;
    }
    input.replace(pos, endPos - pos + 1, targetName);
    lastPos = endPos;
  }

  pos = 0;
  lastPos = pos;
  while (errorString.empty() &&
         (pos = input.find("$<LINK_ONLY:", lastPos)) != std::string::npos) {
    std::string::size_type nameStartPos = pos + sizeof("$<LINK_ONLY:") - 1;
    std::string::size_type endPos = input.find('>', nameStartPos);
    if (endPos == std::string::npos) {
      errorString = "$<LINK_ONLY:...> expression incomplete";
      break;
    }
    std::string libName = input.substr(nameStartPos, endPos - nameStartPos);
    if (cmGeneratorExpression::IsValidTargetName(libName) &&
        this->AddTargetNamespace(libName, target, missingTargets)) {
      input.replace(nameStartPos, endPos - nameStartPos, libName);
    }
    lastPos = nameStartPos + libName.size() + 1;
  }

  this->ReplaceInstallPrefix(input);

  if (!errorString.empty()) {
    target->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                              errorString);
  }
}